

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.h
# Opt level: O2

Name wasm::Names::getValidFunctionName(Module *module,Name root)

{
  long lVar1;
  long lVar2;
  string *in_R9;
  Name root_00;
  IString IVar3;
  string local_70 [32];
  _Any_data local_50;
  code *local_40;
  code *local_38;
  allocator<char> local_29;
  
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/names.h:85:5)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/names.h:85:5)>
             ::_M_manager;
  lVar1 = *(long *)(module + 0x18);
  lVar2 = *(long *)(module + 0x20);
  local_50._M_unused._0_8_ = (undefined8)module;
  std::__cxx11::string::string<std::allocator<char>>(local_70,"_",&local_29);
  root_00.super_IString.str._M_str = (char *)&local_50;
  root_00.super_IString.str._M_len = (size_t)root.super_IString.str._M_str;
  IVar3.str = (string_view)
              getValidName(root.super_IString.str._M_len,root_00,
                           (function<bool_(wasm::Name)> *)((ulong)(lVar2 - lVar1) >> 3 & 0xffffffff)
                           ,(Index)local_70,in_R9);
  std::__cxx11::string::~string(local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  return (IString)(IString)IVar3.str;
}

Assistant:

inline Name getValidFunctionName(Module& module, Name root) {
  return getValidName(
    root,
    [&](Name test) { return !module.getFunctionOrNull(test); },
    module.functions.size());
}